

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void dequantize_row_iq3_s(block_iq3_s *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined8 uVar17;
  ulong uVar18;
  undefined6 uVar19;
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  undefined1 auVar22 [12];
  unkbyte10 Var23;
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  undefined1 auVar28 [13];
  byte bVar29;
  byte bVar30;
  long lVar31;
  long lVar32;
  uint8_t *puVar33;
  uint8_t *puVar34;
  uint8_t *puVar35;
  ulong uVar36;
  uint8_t *puVar37;
  uint8_t *puVar38;
  int l;
  long lVar39;
  uint8_t *puVar40;
  uint8_t *puVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  uint uVar49;
  uint uVar64;
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [12];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  float fVar80;
  float fVar83;
  float fVar84;
  undefined1 auVar81 [12];
  float fVar85;
  undefined1 auVar86 [12];
  undefined1 auVar46 [16];
  undefined2 uVar47;
  undefined1 auVar52 [16];
  undefined1 auVar50 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar60 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar76 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar82 [16];
  undefined1 auVar87 [16];
  
  lVar31 = k + 0xff;
  if (-1 < k) {
    lVar31 = k;
  }
  if (0xff < k) {
    puVar35 = x->qs + 9;
    puVar38 = x->signs + 4;
    lVar32 = 0;
    auVar43._4_8_ = 0x404040402020202;
    auVar43._0_4_ = 0x1010101;
    auVar43._12_4_ = 0;
    auVar44 = ZEXT416(0x80402010);
    uVar47 = CONCAT11(auVar44[3],auVar44[3]);
    uVar17 = CONCAT35(CONCAT21(uVar47,auVar44[2]),CONCAT14(auVar44[2],0x80402010));
    uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),auVar44[1]),auVar44[1]);
    auVar44._0_2_ = CONCAT11(auVar44[0],auVar44[0]);
    uVar36 = CONCAT62(uVar19,auVar44._0_2_);
    auVar46._8_4_ = 0;
    auVar46._0_8_ = uVar36;
    auVar46._12_2_ = uVar47;
    auVar46._14_2_ = uVar47;
    uVar47 = (undefined2)((ulong)uVar17 >> 0x20);
    auVar45._12_4_ = auVar46._12_4_;
    auVar45._8_2_ = 0;
    auVar45._0_8_ = uVar36;
    auVar45._10_2_ = uVar47;
    auVar66._10_6_ = auVar45._10_6_;
    auVar66._8_2_ = uVar47;
    auVar66._0_8_ = uVar36;
    uVar47 = (undefined2)uVar19;
    auVar44._8_8_ = auVar66._8_8_;
    auVar44._6_2_ = uVar47;
    auVar44._4_2_ = uVar47;
    auVar44._2_2_ = auVar44._0_2_;
    do {
      puVar40 = x[lVar32].qs;
      fVar1 = ggml_table_f32_f16[x[lVar32].d];
      puVar41 = x[lVar32].qh;
      puVar34 = x[lVar32].signs;
      puVar33 = puVar35;
      uVar36 = 0;
      puVar37 = puVar38;
      do {
        bVar2 = x[lVar32].scales[uVar36 >> 1];
        fVar48 = (float)(byte)((bVar2 & 0xf) * '\x02' + 1) * fVar1;
        bVar30 = *puVar41;
        bVar29 = 7;
        lVar39 = 0;
        do {
          bVar3 = puVar40[lVar39 * 2 + 1];
          auVar66 = ZEXT216(CONCAT11(puVar34[lVar39],puVar34[lVar39]));
          auVar66 = pshuflw(auVar66,auVar66,0);
          uVar4 = iq3s_grid[(uint)bVar30 << (bVar29 + 1 & 0x1f) & 0x100 | (uint)puVar40[lVar39 * 2]]
          ;
          uVar18 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
          auVar5._8_4_ = 0;
          auVar5._0_8_ = uVar18;
          auVar5[0xc] = (char)(uVar4 >> 0x18);
          auVar6[8] = (char)(uVar4 >> 0x10);
          auVar6._0_8_ = uVar18;
          auVar6[9] = 0;
          auVar6._10_3_ = auVar5._10_3_;
          auVar20._5_8_ = 0;
          auVar20._0_5_ = auVar6._8_5_;
          auVar7[4] = (char)(uVar4 >> 8);
          auVar7._0_4_ = (int)uVar18;
          auVar7[5] = 0;
          auVar7._6_7_ = SUB137(auVar20 << 0x40,6);
          fVar80 = (float)(int)uVar18 * fVar48;
          fVar83 = (float)auVar7._4_4_ * fVar48;
          fVar84 = (float)auVar6._8_4_ * fVar48;
          fVar85 = (float)(uint3)(auVar5._10_3_ >> 0x10) * fVar48;
          auVar74._0_14_ = auVar66._0_14_;
          auVar74[0xe] = auVar66[7];
          auVar74[0xf] = auVar66[7];
          auVar73._14_2_ = auVar74._14_2_;
          auVar73._0_13_ = auVar66._0_13_;
          auVar73[0xd] = auVar66[6];
          auVar72._13_3_ = auVar73._13_3_;
          auVar72._0_12_ = auVar66._0_12_;
          auVar72[0xc] = auVar66[6];
          auVar71._12_4_ = auVar72._12_4_;
          auVar71._0_11_ = auVar66._0_11_;
          auVar71[0xb] = auVar66[5];
          auVar70._11_5_ = auVar71._11_5_;
          auVar70._0_10_ = auVar66._0_10_;
          auVar70[10] = auVar66[5];
          auVar69._10_6_ = auVar70._10_6_;
          auVar69._0_9_ = auVar66._0_9_;
          auVar69[9] = auVar66[4];
          auVar68._9_7_ = auVar69._9_7_;
          auVar68._0_8_ = auVar66._0_8_;
          auVar68[8] = auVar66[4];
          Var23 = CONCAT91(CONCAT81(auVar68._8_8_,auVar66[3]),auVar66[3]);
          auVar22._2_10_ = Var23;
          auVar22[1] = auVar66[2];
          auVar22[0] = auVar66[2];
          auVar21._2_12_ = auVar22;
          auVar21[1] = auVar66[1];
          auVar21[0] = auVar66[1];
          auVar67._0_2_ = CONCAT11(auVar66[0],auVar66[0]);
          auVar67._2_14_ = auVar21;
          uVar47 = (undefined2)Var23;
          auVar77._0_12_ = auVar67._0_12_;
          auVar77._12_2_ = uVar47;
          auVar77._14_2_ = uVar47;
          auVar76._12_4_ = auVar77._12_4_;
          auVar76._0_10_ = auVar67._0_10_;
          auVar76._10_2_ = auVar22._0_2_;
          auVar75._10_6_ = auVar76._10_6_;
          auVar75._0_8_ = auVar67._0_8_;
          auVar75._8_2_ = auVar22._0_2_;
          auVar78._8_8_ = auVar75._8_8_;
          auVar78._6_2_ = auVar21._0_2_;
          auVar78._4_2_ = auVar21._0_2_;
          auVar78._2_2_ = auVar67._0_2_;
          auVar78._0_2_ = auVar67._0_2_;
          auVar66 = auVar43 & auVar78;
          uVar49 = CONCAT13(-(auVar66[3] == '\0'),
                            CONCAT12(-(auVar66[2] == '\0'),
                                     CONCAT11(-(auVar66[1] == '\0'),-(auVar66[0] == '\0'))));
          auVar86._0_8_ =
               CONCAT17(-(auVar66[7] == '\0'),
                        CONCAT16(-(auVar66[6] == '\0'),
                                 CONCAT15(-(auVar66[5] == '\0'),
                                          CONCAT14(-(auVar66[4] == '\0'),uVar49))));
          auVar86[8] = -(auVar66[8] == '\0');
          auVar86[9] = -(auVar66[9] == '\0');
          auVar86[10] = -(auVar66[10] == '\0');
          auVar86[0xb] = -(auVar66[0xb] == '\0');
          auVar87[0xc] = -(auVar66[0xc] == '\0');
          auVar87._0_12_ = auVar86;
          auVar87[0xd] = -(auVar66[0xd] == '\0');
          auVar87[0xe] = -(auVar66[0xe] == '\0');
          auVar87[0xf] = -(auVar66[0xf] == '\0');
          uVar64 = (uint)((ulong)auVar86._0_8_ >> 0x20);
          *y = (float)(~uVar49 & (uint)-fVar80 | (uint)fVar80 & uVar49);
          y[1] = (float)(~uVar64 & (uint)-fVar83 | (uint)fVar83 & uVar64);
          y[2] = (float)(~auVar86._8_4_ & (uint)-fVar84 | (uint)fVar84 & auVar86._8_4_);
          y[3] = (float)(~auVar87._12_4_ & (uint)-fVar85 | (uint)fVar85 & auVar87._12_4_);
          uVar4 = iq3s_grid[(uint)bVar30 << (bVar29 & 0x1f) & 0x100 | (uint)bVar3];
          uVar18 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar18;
          auVar8[0xc] = (char)(uVar4 >> 0x18);
          auVar9[8] = (char)(uVar4 >> 0x10);
          auVar9._0_8_ = uVar18;
          auVar9[9] = 0;
          auVar9._10_3_ = auVar8._10_3_;
          auVar24._5_8_ = 0;
          auVar24._0_5_ = auVar9._8_5_;
          auVar10[4] = (char)(uVar4 >> 8);
          auVar10._0_4_ = (int)uVar18;
          auVar10[5] = 0;
          auVar10._6_7_ = SUB137(auVar24 << 0x40,6);
          fVar80 = (float)(int)uVar18 * fVar48;
          fVar83 = (float)auVar10._4_4_ * fVar48;
          fVar84 = (float)auVar9._8_4_ * fVar48;
          fVar85 = (float)(uint3)(auVar8._10_3_ >> 0x10) * fVar48;
          auVar78 = auVar78 & auVar44;
          uVar49 = CONCAT13(-(auVar78[3] == '\0'),
                            CONCAT12(-(auVar78[2] == '\0'),
                                     CONCAT11(-(auVar78[1] == '\0'),-(auVar78[0] == '\0'))));
          auVar65._0_8_ =
               CONCAT17(-(auVar78[7] == '\0'),
                        CONCAT16(-(auVar78[6] == '\0'),
                                 CONCAT15(-(auVar78[5] == '\0'),
                                          CONCAT14(-(auVar78[4] == '\0'),uVar49))));
          auVar65[8] = -(auVar78[8] == '\0');
          auVar65[9] = -(auVar78[9] == '\0');
          auVar65[10] = -(auVar78[10] == '\0');
          auVar65[0xb] = -(auVar78[0xb] == '\0');
          auVar79[0xc] = -(auVar78[0xc] == '\0');
          auVar79._0_12_ = auVar65;
          auVar79[0xd] = -(auVar78[0xd] == '\0');
          auVar79[0xe] = -(auVar78[0xe] == '\0');
          auVar79[0xf] = -(auVar78[0xf] == '\0');
          uVar64 = (uint)((ulong)auVar65._0_8_ >> 0x20);
          y[4] = (float)(~uVar49 & (uint)-fVar80 | (uint)fVar80 & uVar49);
          y[5] = (float)(~uVar64 & (uint)-fVar83 | (uint)fVar83 & uVar64);
          y[6] = (float)(~auVar65._8_4_ & (uint)-fVar84 | (uint)fVar84 & auVar65._8_4_);
          y[7] = (float)(~auVar79._12_4_ & (uint)-fVar85 | (uint)fVar85 & auVar79._12_4_);
          y = y + 8;
          lVar39 = lVar39 + 1;
          bVar29 = bVar29 - 2;
        } while (lVar39 != 4);
        fVar48 = (float)(byte)(bVar2 >> 3 | 1) * fVar1;
        bVar2 = puVar41[1];
        bVar30 = 7;
        lVar39 = 0;
        do {
          bVar29 = puVar33[lVar39 * 2];
          auVar66 = ZEXT216(CONCAT11(puVar37[lVar39],puVar37[lVar39]));
          auVar66 = pshuflw(auVar66,auVar66,0);
          uVar4 = iq3s_grid[(uint)bVar2 << (bVar30 + 1 & 0x1f) & 0x100 |
                            (uint)puVar33[lVar39 * 2 + -1]];
          uVar18 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
          auVar11._8_4_ = 0;
          auVar11._0_8_ = uVar18;
          auVar11[0xc] = (char)(uVar4 >> 0x18);
          auVar12[8] = (char)(uVar4 >> 0x10);
          auVar12._0_8_ = uVar18;
          auVar12[9] = 0;
          auVar12._10_3_ = auVar11._10_3_;
          auVar25._5_8_ = 0;
          auVar25._0_5_ = auVar12._8_5_;
          auVar13[4] = (char)(uVar4 >> 8);
          auVar13._0_4_ = (int)uVar18;
          auVar13[5] = 0;
          auVar13._6_7_ = SUB137(auVar25 << 0x40,6);
          fVar80 = (float)(int)uVar18 * fVar48;
          fVar83 = (float)auVar13._4_4_ * fVar48;
          fVar84 = (float)auVar12._8_4_ * fVar48;
          fVar85 = (float)(uint3)(auVar11._10_3_ >> 0x10) * fVar48;
          auVar58._0_14_ = auVar66._0_14_;
          auVar58[0xe] = auVar66[7];
          auVar58[0xf] = auVar66[7];
          auVar57._14_2_ = auVar58._14_2_;
          auVar57._0_13_ = auVar66._0_13_;
          auVar57[0xd] = auVar66[6];
          auVar56._13_3_ = auVar57._13_3_;
          auVar56._0_12_ = auVar66._0_12_;
          auVar56[0xc] = auVar66[6];
          auVar55._12_4_ = auVar56._12_4_;
          auVar55._0_11_ = auVar66._0_11_;
          auVar55[0xb] = auVar66[5];
          auVar54._11_5_ = auVar55._11_5_;
          auVar54._0_10_ = auVar66._0_10_;
          auVar54[10] = auVar66[5];
          auVar53._10_6_ = auVar54._10_6_;
          auVar53._0_9_ = auVar66._0_9_;
          auVar53[9] = auVar66[4];
          auVar52._9_7_ = auVar53._9_7_;
          auVar52._0_8_ = auVar66._0_8_;
          auVar52[8] = auVar66[4];
          Var23 = CONCAT91(CONCAT81(auVar52._8_8_,auVar66[3]),auVar66[3]);
          auVar27._2_10_ = Var23;
          auVar27[1] = auVar66[2];
          auVar27[0] = auVar66[2];
          auVar26._2_12_ = auVar27;
          auVar26[1] = auVar66[1];
          auVar26[0] = auVar66[1];
          auVar51._0_2_ = CONCAT11(auVar66[0],auVar66[0]);
          auVar51._2_14_ = auVar26;
          uVar47 = (undefined2)Var23;
          auVar61._0_12_ = auVar51._0_12_;
          auVar61._12_2_ = uVar47;
          auVar61._14_2_ = uVar47;
          auVar60._12_4_ = auVar61._12_4_;
          auVar60._0_10_ = auVar51._0_10_;
          auVar60._10_2_ = auVar27._0_2_;
          auVar59._10_6_ = auVar60._10_6_;
          auVar59._0_8_ = auVar51._0_8_;
          auVar59._8_2_ = auVar27._0_2_;
          auVar62._8_8_ = auVar59._8_8_;
          auVar62._6_2_ = auVar26._0_2_;
          auVar62._4_2_ = auVar26._0_2_;
          auVar62._2_2_ = auVar51._0_2_;
          auVar62._0_2_ = auVar51._0_2_;
          auVar66 = auVar43 & auVar62;
          uVar49 = CONCAT13(-(auVar66[3] == '\0'),
                            CONCAT12(-(auVar66[2] == '\0'),
                                     CONCAT11(-(auVar66[1] == '\0'),-(auVar66[0] == '\0'))));
          auVar81._0_8_ =
               CONCAT17(-(auVar66[7] == '\0'),
                        CONCAT16(-(auVar66[6] == '\0'),
                                 CONCAT15(-(auVar66[5] == '\0'),
                                          CONCAT14(-(auVar66[4] == '\0'),uVar49))));
          auVar81[8] = -(auVar66[8] == '\0');
          auVar81[9] = -(auVar66[9] == '\0');
          auVar81[10] = -(auVar66[10] == '\0');
          auVar81[0xb] = -(auVar66[0xb] == '\0');
          auVar82[0xc] = -(auVar66[0xc] == '\0');
          auVar82._0_12_ = auVar81;
          auVar82[0xd] = -(auVar66[0xd] == '\0');
          auVar82[0xe] = -(auVar66[0xe] == '\0');
          auVar82[0xf] = -(auVar66[0xf] == '\0');
          uVar64 = (uint)((ulong)auVar81._0_8_ >> 0x20);
          *y = (float)(~uVar49 & (uint)-fVar80 | (uint)fVar80 & uVar49);
          y[1] = (float)(~uVar64 & (uint)-fVar83 | (uint)fVar83 & uVar64);
          y[2] = (float)(~auVar81._8_4_ & (uint)-fVar84 | (uint)fVar84 & auVar81._8_4_);
          y[3] = (float)(~auVar82._12_4_ & (uint)-fVar85 | (uint)fVar85 & auVar82._12_4_);
          uVar4 = iq3s_grid[(uint)bVar2 << (bVar30 & 0x1f) & 0x100 | (uint)bVar29];
          uVar18 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
          auVar14._8_4_ = 0;
          auVar14._0_8_ = uVar18;
          auVar14[0xc] = (char)(uVar4 >> 0x18);
          auVar15[8] = (char)(uVar4 >> 0x10);
          auVar15._0_8_ = uVar18;
          auVar15[9] = 0;
          auVar15._10_3_ = auVar14._10_3_;
          auVar28._5_8_ = 0;
          auVar28._0_5_ = auVar15._8_5_;
          auVar16[4] = (char)(uVar4 >> 8);
          auVar16._0_4_ = (int)uVar18;
          auVar16[5] = 0;
          auVar16._6_7_ = SUB137(auVar28 << 0x40,6);
          fVar80 = (float)(int)uVar18 * fVar48;
          fVar83 = (float)auVar16._4_4_ * fVar48;
          fVar84 = (float)auVar15._8_4_ * fVar48;
          fVar85 = (float)(uint3)(auVar14._10_3_ >> 0x10) * fVar48;
          auVar62 = auVar62 & auVar44;
          uVar49 = CONCAT13(-(auVar62[3] == '\0'),
                            CONCAT12(-(auVar62[2] == '\0'),
                                     CONCAT11(-(auVar62[1] == '\0'),-(auVar62[0] == '\0'))));
          auVar50._0_8_ =
               CONCAT17(-(auVar62[7] == '\0'),
                        CONCAT16(-(auVar62[6] == '\0'),
                                 CONCAT15(-(auVar62[5] == '\0'),
                                          CONCAT14(-(auVar62[4] == '\0'),uVar49))));
          auVar50[8] = -(auVar62[8] == '\0');
          auVar50[9] = -(auVar62[9] == '\0');
          auVar50[10] = -(auVar62[10] == '\0');
          auVar50[0xb] = -(auVar62[0xb] == '\0');
          auVar63[0xc] = -(auVar62[0xc] == '\0');
          auVar63._0_12_ = auVar50;
          auVar63[0xd] = -(auVar62[0xd] == '\0');
          auVar63[0xe] = -(auVar62[0xe] == '\0');
          auVar63[0xf] = -(auVar62[0xf] == '\0');
          uVar64 = (uint)((ulong)auVar50._0_8_ >> 0x20);
          y[4] = (float)(~uVar49 & (uint)-fVar80 | (uint)fVar80 & uVar49);
          y[5] = (float)(~uVar64 & (uint)-fVar83 | (uint)fVar83 & uVar64);
          y[6] = (float)(~auVar50._8_4_ & (uint)-fVar84 | (uint)fVar84 & auVar50._8_4_);
          y[7] = (float)(~auVar63._12_4_ & (uint)-fVar85 | (uint)fVar85 & auVar63._12_4_);
          y = y + 8;
          lVar39 = lVar39 + 1;
          bVar30 = bVar30 - 2;
        } while (lVar39 != 4);
        puVar41 = puVar41 + 2;
        puVar40 = puVar40 + 0x10;
        puVar34 = puVar34 + 8;
        puVar33 = puVar33 + 0x10;
        puVar37 = puVar37 + 8;
        bVar42 = uVar36 < 6;
        uVar36 = uVar36 + 2;
      } while (bVar42);
      lVar32 = lVar32 + 1;
      puVar35 = puVar35 + 0x6e;
      puVar38 = puVar38 + 0x6e;
    } while (lVar32 != lVar31 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_iq3_s(const block_iq3_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;
        const uint8_t * signs = x[i].signs;

        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const float db1 = d * (1 + 2*(x[i].scales[ib32/2] & 0xf));
            const float db2 = d * (1 + 2*(x[i].scales[ib32/2] >>  4));
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid1 = (const uint8_t *)(iq3s_grid + (qs[2*l+0] | ((qh[0] << (8-2*l)) & 256)));
                const uint8_t * grid2 = (const uint8_t *)(iq3s_grid + (qs[2*l+1] | ((qh[0] << (7-2*l)) & 256)));
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db1 * grid1[j] * (signs[l] & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db1 * grid2[j] * (signs[l] & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 8;
            signs += 4;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid1 = (const uint8_t *)(iq3s_grid + (qs[2*l+0] | ((qh[1] << (8-2*l)) & 256)));
                const uint8_t * grid2 = (const uint8_t *)(iq3s_grid + (qs[2*l+1] | ((qh[1] << (7-2*l)) & 256)));
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db2 * grid1[j] * (signs[l] & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db2 * grid2[j] * (signs[l] & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qh += 2;
            qs += 8;
            signs += 4;
        }
    }
}